

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O3

void google::protobuf::util::anon_unknown_0::ConvertOptionField
               (Reflection *reflection,Message *options,FieldDescriptor *field,int index,Option *out
               )

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  int32_t iVar5;
  uint32_t uVar6;
  Any *this;
  Message *message;
  uint64_t uVar7;
  EnumValueDescriptor *pEVar8;
  int64_t iVar9;
  byte bVar10;
  Arena *pAVar11;
  Arena *extraout_RDX;
  _Alloc_hider _Var12;
  ArenaStringPtr *this_00;
  float fVar13;
  string_view value;
  Int32Value wrapper;
  undefined1 local_b8 [24];
  uint32_t local_a0;
  undefined4 uStack_9c;
  double local_98;
  undefined1 local_90 [32];
  string local_70;
  undefined1 local_50 [32];
  
  pcVar3 = (field->all_names_).payload_;
  value._M_len = (ulong)*(ushort *)(pcVar3 + ((byte)field->field_0x1 >> 2 & 2));
  (out->field_0)._impl_._has_bits_.has_bits_[0] = (out->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value._M_str = pcVar3 + ~value._M_len;
  pAVar11 = (Arena *)(out->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar11 & 1) != 0) {
    pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(out->field_0)._impl_.name_,value,pAVar11);
  *(byte *)&out->field_0 = *(byte *)&out->field_0 | 2;
  this = (out->field_0)._impl_.value_;
  if (this == (Any *)0x0) {
    pAVar11 = (Arena *)(out->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar11 & 1) != 0) {
      pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
    }
    this = (Any *)Arena::DefaultConstruct<google::protobuf::Any>(pAVar11);
    (out->field_0)._impl_.value_ = this;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    bVar1 = field->field_0x1;
    bVar10 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar10) {
      if ((bVar1 & 0x20) == 0) {
        iVar5 = Reflection::GetInt32(reflection,options,field);
      }
      else {
        iVar5 = Reflection::GetRepeatedInt32(reflection,options,field,index);
      }
      Int32Value::Int32Value((Int32Value *)local_b8,(Arena *)0x0);
      local_a0 = iVar5;
      local_b8[0x10] = local_b8[0x10] | 1;
      Any::PackFrom(this,(Message *)local_b8);
LAB_00fd740c:
      Int32Value::~Int32Value((Int32Value *)local_b8);
      return;
    }
    goto LAB_00fd766b;
  case 2:
    bVar1 = field->field_0x1;
    bVar10 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar10) {
      if ((bVar1 & 0x20) == 0) {
        iVar9 = Reflection::GetInt64(reflection,options,field);
      }
      else {
        iVar9 = Reflection::GetRepeatedInt64(reflection,options,field,index);
      }
      Int64Value::Int64Value((Int64Value *)local_b8,(Arena *)0x0);
      local_b8[0x10] = local_b8[0x10] | 1;
      _local_a0 = iVar9;
      Any::PackFrom(this,(Message *)local_b8);
      Int64Value::~Int64Value((Int64Value *)local_b8);
      return;
    }
    goto LAB_00fd7680;
  case 3:
    bVar1 = field->field_0x1;
    bVar10 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar10) {
      if ((bVar1 & 0x20) == 0) {
        uVar6 = Reflection::GetUInt32(reflection,options,field);
      }
      else {
        uVar6 = Reflection::GetRepeatedUInt32(reflection,options,field,index);
      }
      UInt32Value::UInt32Value((UInt32Value *)local_b8,(Arena *)0x0);
      local_a0 = uVar6;
      local_b8[0x10] = local_b8[0x10] | 1;
      Any::PackFrom(this,(Message *)local_b8);
      UInt32Value::~UInt32Value((UInt32Value *)local_b8);
      return;
    }
    goto LAB_00fd762e;
  case 4:
    bVar1 = field->field_0x1;
    bVar10 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar10) {
      if ((bVar1 & 0x20) == 0) {
        uVar7 = Reflection::GetUInt64(reflection,options,field);
      }
      else {
        uVar7 = Reflection::GetRepeatedUInt64(reflection,options,field,index);
      }
      UInt64Value::UInt64Value((UInt64Value *)local_b8,(Arena *)0x0);
      local_b8[0x10] = local_b8[0x10] | 1;
      _local_a0 = uVar7;
      Any::PackFrom(this,(Message *)local_b8);
      UInt64Value::~UInt64Value((UInt64Value *)local_b8);
      return;
    }
    goto LAB_00fd7643;
  case 5:
    bVar1 = field->field_0x1;
    bVar10 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar10) {
      if ((bVar1 & 0x20) == 0) {
        local_98 = Reflection::GetDouble(reflection,options,field);
      }
      else {
        local_98 = Reflection::GetRepeatedDouble(reflection,options,field,index);
      }
      DoubleValue::DoubleValue((DoubleValue *)local_b8,(Arena *)0x0);
      _local_a0 = local_98;
      local_b8[0x10] = local_b8[0x10] | 1;
      Any::PackFrom(this,(Message *)local_b8);
      DoubleValue::~DoubleValue((DoubleValue *)local_b8);
      return;
    }
    util::_GLOBAL__N_1::ConvertOptionField();
    break;
  case 6:
    bVar1 = field->field_0x1;
    bVar10 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar10) {
      if ((bVar1 & 0x20) == 0) {
        fVar13 = Reflection::GetFloat(reflection,options,field);
      }
      else {
        fVar13 = Reflection::GetRepeatedFloat(reflection,options,field,index);
      }
      local_98 = (double)CONCAT44(local_98._4_4_,fVar13);
      FloatValue::FloatValue((FloatValue *)local_b8,(Arena *)0x0);
      local_a0 = local_98._0_4_;
      local_b8[0x10] = local_b8[0x10] | 1;
      Any::PackFrom(this,(Message *)local_b8);
      FloatValue::~FloatValue((FloatValue *)local_b8);
      return;
    }
    goto LAB_00fd7695;
  case 7:
    bVar1 = field->field_0x1;
    bVar10 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar10) {
      if ((bVar1 & 0x20) == 0) {
        bVar4 = Reflection::GetBool(reflection,options,field);
      }
      else {
        bVar4 = Reflection::GetRepeatedBool(reflection,options,field,index);
      }
      BoolValue::BoolValue((BoolValue *)local_b8,(Arena *)0x0);
      local_a0._0_1_ = bVar4;
      local_b8[0x10] = local_b8[0x10] | 1;
      Any::PackFrom(this,(Message *)local_b8);
      BoolValue::~BoolValue((BoolValue *)local_b8);
      return;
    }
    goto LAB_00fd76aa;
  case 8:
    bVar1 = field->field_0x1;
    bVar10 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar10) {
      if ((bVar1 & 0x20) == 0) {
        pEVar8 = Reflection::GetEnum(reflection,options,field);
      }
      else {
        pEVar8 = Reflection::GetRepeatedEnum(reflection,options,field,index);
      }
      iVar2 = pEVar8->number_;
      Int32Value::Int32Value((Int32Value *)local_b8,(Arena *)0x0);
      local_a0 = iVar2;
      local_b8[0x10] = local_b8[0x10] | 1;
      Any::PackFrom(this,(Message *)local_b8);
      goto LAB_00fd740c;
    }
    goto LAB_00fd7658;
  case 9:
    bVar1 = field->field_0x1;
    bVar10 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 != (bool)bVar10) goto LAB_00fd76bf;
    if ((bVar1 & 0x20) == 0) {
      Reflection::GetString_abi_cxx11_((string *)local_b8,reflection,options,field);
    }
    else {
      Reflection::GetRepeatedString_abi_cxx11_((string *)local_b8,reflection,options,field,index);
    }
    if (field->type_ == '\t') {
      field = (FieldDescriptor *)(local_50 + 0x10);
      local_50._0_8_ = field;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_b8._0_8_,(pointer)(local_b8._0_8_ + local_b8._8_8_));
      StringValue::StringValue((StringValue *)local_90,(Arena *)0x0);
      this_00 = (ArenaStringPtr *)(local_90 + 0x18);
      local_90[0x10] = local_90[0x10] | 1;
      if ((local_90._8_8_ & 1) != 0) goto LAB_00fd76d4;
      goto LAB_00fd7512;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_b8._0_8_,(pointer)(local_b8._0_8_ + local_b8._8_8_));
    BytesValue::BytesValue((BytesValue *)local_90,(Arena *)0x0);
    local_90[0x10] = local_90[0x10] | 1;
    if ((local_90._8_8_ & 1) != 0) {
      local_90._8_8_ = *(undefined8 *)(local_90._8_8_ & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(local_90 + 0x18),&local_70,(Arena *)local_90._8_8_);
    Any::PackFrom(this,(Message *)local_90);
    BytesValue::~BytesValue((BytesValue *)local_90);
    _Var12._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_00fd75b9;
    goto LAB_00fd75c1;
  case 10:
    bVar1 = field->field_0x1;
    bVar10 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar10) {
      if ((bVar1 & 0x20) == 0) {
        message = Reflection::GetMessage(reflection,options,field,(MessageFactory *)0x0);
      }
      else {
        message = Reflection::GetRepeatedMessage(reflection,options,field,index);
      }
      Any::PackFrom(this,message);
      return;
    }
    break;
  default:
    goto switchD_00fd70c8_default;
  }
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_00fd762e:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_00fd7643:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_00fd7658:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_00fd766b:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_00fd7680:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_00fd7695:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_00fd76aa:
  util::_GLOBAL__N_1::ConvertOptionField();
LAB_00fd76bf:
  this_00 = (ArenaStringPtr *)(ulong)bVar10;
  util::_GLOBAL__N_1::ConvertOptionField();
  local_90._8_8_ = extraout_RDX;
LAB_00fd76d4:
  local_90._8_8_ = *(undefined8 *)(local_90._8_8_ & 0xfffffffffffffffe);
LAB_00fd7512:
  protobuf::internal::ArenaStringPtr::Set<>(this_00,(string *)local_50,(Arena *)local_90._8_8_);
  Any::PackFrom(this,(Message *)local_90);
  StringValue::~StringValue((StringValue *)local_90);
  local_70.field_2._M_allocated_capacity = local_50._16_8_;
  _Var12._M_p = (pointer)local_50._0_8_;
  if ((FieldDescriptor *)local_50._0_8_ != field) {
LAB_00fd75b9:
    operator_delete(_Var12._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_00fd75c1:
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
  }
switchD_00fd70c8_default:
  return;
}

Assistant:

void ConvertOptionField(const Reflection* reflection, const Message& options,
                        const FieldDescriptor* field, int index, Option* out) {
  out->set_name(field->is_extension() ? field->full_name() : field->name());
  Any* value = out->mutable_value();
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_MESSAGE:
      value->PackFrom(
          field->is_repeated()
              ? reflection->GetRepeatedMessage(options, field, index)
              : reflection->GetMessage(options, field));
      return;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      value->PackFrom(WrapValue<DoubleValue>(
          field->is_repeated()
              ? reflection->GetRepeatedDouble(options, field, index)
              : reflection->GetDouble(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_FLOAT:
      value->PackFrom(WrapValue<FloatValue>(
          field->is_repeated()
              ? reflection->GetRepeatedFloat(options, field, index)
              : reflection->GetFloat(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      value->PackFrom(WrapValue<Int64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt64(options, field, index)
              : reflection->GetInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      value->PackFrom(WrapValue<UInt64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt64(options, field, index)
              : reflection->GetUInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      value->PackFrom(WrapValue<Int32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt32(options, field, index)
              : reflection->GetInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      value->PackFrom(WrapValue<UInt32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt32(options, field, index)
              : reflection->GetUInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      value->PackFrom(WrapValue<BoolValue>(
          field->is_repeated()
              ? reflection->GetRepeatedBool(options, field, index)
              : reflection->GetBool(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_STRING: {
      const std::string& val =
          field->is_repeated()
              ? reflection->GetRepeatedString(options, field, index)
              : reflection->GetString(options, field);
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        value->PackFrom(WrapValue<StringValue>(val));
      } else {
        value->PackFrom(WrapValue<BytesValue>(val));
      }
      return;
    }
    case FieldDescriptor::CPPTYPE_ENUM: {
      const EnumValueDescriptor* val =
          field->is_repeated()
              ? reflection->GetRepeatedEnum(options, field, index)
              : reflection->GetEnum(options, field);
      value->PackFrom(WrapValue<Int32Value>(val->number()));
      return;
    }
  }
}